

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O0

bool __thiscall spvtools::opt::CodeSinkingPass::HasUniformMemorySync(CodeSinkingPass *this)

{
  Module *this_00;
  anon_class_16_2_3b49f75b local_50;
  function<void_(spvtools::opt::Instruction_*)> local_40;
  bool local_19;
  CodeSinkingPass *pCStack_18;
  bool has_sync;
  CodeSinkingPass *this_local;
  
  if (((this->super_Pass).field_0x31 & 1) == 0) {
    local_19 = false;
    pCStack_18 = this;
    this_00 = Pass::get_module(&this->super_Pass);
    local_50.has_sync = &local_19;
    local_50.this = this;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::CodeSinkingPass::HasUniformMemorySync()::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_40,&local_50);
    Module::ForEachInst(this_00,&local_40,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_40);
    (this->super_Pass).field_0x32 = local_19 & 1;
  }
  else {
    local_19 = (bool)(this->super_Pass).field_0x32;
  }
  this_local._7_1_ = (bool)(local_19 & 1);
  return this_local._7_1_;
}

Assistant:

bool CodeSinkingPass::HasUniformMemorySync() {
  if (checked_for_uniform_sync_) {
    return has_uniform_sync_;
  }

  bool has_sync = false;
  get_module()->ForEachInst([this, &has_sync](Instruction* inst) {
    switch (inst->opcode()) {
      case spv::Op::OpMemoryBarrier: {
        uint32_t mem_semantics_id = inst->GetSingleWordInOperand(1);
        if (IsSyncOnUniform(mem_semantics_id)) {
          has_sync = true;
        }
        break;
      }
      case spv::Op::OpControlBarrier:
      case spv::Op::OpAtomicLoad:
      case spv::Op::OpAtomicStore:
      case spv::Op::OpAtomicExchange:
      case spv::Op::OpAtomicIIncrement:
      case spv::Op::OpAtomicIDecrement:
      case spv::Op::OpAtomicIAdd:
      case spv::Op::OpAtomicFAddEXT:
      case spv::Op::OpAtomicISub:
      case spv::Op::OpAtomicSMin:
      case spv::Op::OpAtomicUMin:
      case spv::Op::OpAtomicFMinEXT:
      case spv::Op::OpAtomicSMax:
      case spv::Op::OpAtomicUMax:
      case spv::Op::OpAtomicFMaxEXT:
      case spv::Op::OpAtomicAnd:
      case spv::Op::OpAtomicOr:
      case spv::Op::OpAtomicXor:
      case spv::Op::OpAtomicFlagTestAndSet:
      case spv::Op::OpAtomicFlagClear: {
        uint32_t mem_semantics_id = inst->GetSingleWordInOperand(2);
        if (IsSyncOnUniform(mem_semantics_id)) {
          has_sync = true;
        }
        break;
      }
      case spv::Op::OpAtomicCompareExchange:
      case spv::Op::OpAtomicCompareExchangeWeak:
        if (IsSyncOnUniform(inst->GetSingleWordInOperand(2)) ||
            IsSyncOnUniform(inst->GetSingleWordInOperand(3))) {
          has_sync = true;
        }
        break;
      default:
        break;
    }
  });
  has_uniform_sync_ = has_sync;
  return has_sync;
}